

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

Node ** __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::UArrIntermediateNode::
childByTop(UArrIntermediateNode *this,Top t,bool canCreate)

{
  Node **ppNVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  Top TVar7;
  Coproduct<Kernel::VarNumber,_Kernel::SymbolId> local_50;
  Coproduct<Kernel::VarNumber,_Kernel::SymbolId> local_40;
  
  local_40._inner._0_8_ = t._inner._inner._0_8_;
  local_40._inner._content[7] = t._inner._inner._content[7];
  puVar6 = &(this->super_IntermediateNode).childVar;
  lVar5 = 0;
  do {
    lVar4 = (long)*(int *)&(this->super_IntermediateNode).field_0x14;
    if (lVar4 <= lVar5) {
      if (canCreate && lVar4 <= lVar5) {
        iVar2 = *(int *)&(this->super_IntermediateNode).field_0x14;
        *(int *)&(this->super_IntermediateNode).field_0x14 = iVar2 + 1;
        this->_nodes[(long)iVar2 + 1] = (Node *)0x0;
        return this->_nodes + iVar2;
      }
      return (Node **)0x0;
    }
    ppNVar1 = (Node **)(puVar6 + 2);
    puVar6 = puVar6 + 2;
    TVar7 = Kernel::TermList::top(&(*ppNVar1)->_term);
    local_50._inner._0_8_ = TVar7._inner._inner._0_8_;
    local_50._inner._content[7] = TVar7._inner._inner._content[7];
    bVar3 = Lib::operator==(&local_40,&local_50);
    lVar5 = lVar5 + 1;
  } while (!bVar3);
  return (Node **)puVar6;
}

Assistant:

typename SubstitutionTree<LeafData_>::Node** SubstitutionTree<LeafData_>::UArrIntermediateNode::
	childByTop(TermList::Top t, bool canCreate)
{
  for(int i=0;i<_size;i++) {
    if(t == _nodes[i]->top()) {
      return &_nodes[i];
    }
  }
  if(canCreate) {
    ASS_L(_size,UARR_INTERMEDIATE_NODE_MAX_SIZE);
    ASS_EQ(_nodes[_size],0);
    _nodes[++_size]=0;
    return &_nodes[_size-1];
  }
  return 0;
}